

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfMultiPartOutputFile.cpp
# Opt level: O2

void __thiscall
Imf_3_4::MultiPartOutputFile::MultiPartOutputFile
          (MultiPartOutputFile *this,OStream *os,Header *headers,int parts,
          bool overrideSharedAttributes,int numThreads)

{
  _Rb_tree_header *p_Var1;
  Header *headers_00;
  Data *pDVar2;
  ulong uVar3;
  ulong uVar4;
  OutputPartData *this_00;
  long lVar5;
  stringstream _iex_replace_s;
  
  GenericOutputFile::GenericOutputFile(&this->super_GenericOutputFile);
  (this->super_GenericOutputFile)._vptr_GenericOutputFile =
       (_func_int **)&PTR__MultiPartOutputFile_001e3d28;
  pDVar2 = (Data *)operator_new(0xa0);
  (pDVar2->parts).
  super__Vector_base<Imf_3_4::OutputPartData_*,_std::allocator<Imf_3_4::OutputPartData_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (pDVar2->parts).
  super__Vector_base<Imf_3_4::OutputPartData_*,_std::allocator<Imf_3_4::OutputPartData_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (pDVar2->super_OutputStreamMutex).currentPosition = 0;
  (pDVar2->parts).
  super__Vector_base<Imf_3_4::OutputPartData_*,_std::allocator<Imf_3_4::OutputPartData_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pDVar2->super_OutputStreamMutex).super_mutex.super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  (pDVar2->super_OutputStreamMutex).os = (OStream *)0x0;
  *(undefined8 *)
   ((long)&(pDVar2->super_OutputStreamMutex).super_mutex.super___mutex_base._M_mutex + 0x10) = 0;
  (pDVar2->super_OutputStreamMutex).super_mutex.super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (pDVar2->super_OutputStreamMutex).super_mutex.super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)
   ((long)&(pDVar2->super_OutputStreamMutex).super_mutex.super___mutex_base._M_mutex + 8) = 0;
  pDVar2->deleteStream = false;
  pDVar2->numThreads = numThreads;
  (pDVar2->_outputFiles)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (pDVar2->_outputFiles)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var1 = &(pDVar2->_outputFiles)._M_t._M_impl.super__Rb_tree_header;
  (pDVar2->_outputFiles)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (pDVar2->_outputFiles)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (pDVar2->_outputFiles)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (pDVar2->_headers).super__Vector_base<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pDVar2->_headers).super__Vector_base<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (pDVar2->_headers).super__Vector_base<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->_data = pDVar2;
  std::vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>::resize
            (&pDVar2->_headers,(long)parts);
  (this->_data->super_OutputStreamMutex).os = os;
  lVar5 = 0;
  uVar3 = 0;
  if (0 < parts) {
    uVar3 = (ulong)(uint)parts;
  }
  for (; uVar3 * 0x38 - lVar5 != 0; lVar5 = lVar5 + 0x38) {
    Header::operator=((Header *)
                      ((long)&(((this->_data->_headers).
                                super__Vector_base<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>
                                ._M_impl.super__Vector_impl_data._M_start)->_map)._M_t._M_impl +
                      lVar5),(Header *)(&(headers->_map)._M_t._M_impl.field_0x0 + lVar5));
  }
  Data::do_header_sanity_checks(this->_data,overrideSharedAttributes);
  lVar5 = 0;
  uVar3 = 0;
  while( true ) {
    pDVar2 = this->_data;
    headers_00 = (pDVar2->_headers).
                 super__Vector_base<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>._M_impl.
                 super__Vector_impl_data._M_start;
    uVar4 = ((long)(pDVar2->_headers).
                   super__Vector_base<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>._M_impl.
                   super__Vector_impl_data._M_finish - (long)headers_00) / 0x38;
    if (uVar4 <= uVar3) break;
    this_00 = (OutputPartData *)operator_new(0x60);
    OutputPartData::OutputPartData
              (this_00,&pDVar2->super_OutputStreamMutex,
               (Header *)
               ((long)&(((pDVar2->_headers).
                         super__Vector_base<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>.
                         _M_impl.super__Vector_impl_data._M_start)->_map)._M_t._M_impl + lVar5),
               (int)uVar3,numThreads,1 < parts);
    __iex_replace_s = this_00;
    std::vector<Imf_3_4::OutputPartData*,std::allocator<Imf_3_4::OutputPartData*>>::
    emplace_back<Imf_3_4::OutputPartData*>
              ((vector<Imf_3_4::OutputPartData*,std::allocator<Imf_3_4::OutputPartData*>> *)
               &pDVar2->parts,(OutputPartData **)&_iex_replace_s);
    uVar3 = uVar3 + 1;
    lVar5 = lVar5 + 0x38;
  }
  GenericOutputFile::writeMagicNumberAndVersionField
            (&this->super_GenericOutputFile,(pDVar2->super_OutputStreamMutex).os,headers_00,
             (int)uVar4);
  Data::writeHeadersToFile(this->_data,&this->_data->_headers);
  Data::writeChunkTableOffsets(this->_data,&this->_data->parts);
  return;
}

Assistant:

MultiPartOutputFile::MultiPartOutputFile (
    OStream&      os,
    const Header* headers,
    int           parts,
    bool          overrideSharedAttributes,
    int           numThreads)
    : _data (new Data (false, numThreads))
{
    // grab headers
    _data->_headers.resize (parts);
    _data->os = &os;

    for (int i = 0; i < parts; i++)
    {
        _data->_headers[i] = headers[i];
    }
    try
    {

        _data->do_header_sanity_checks (overrideSharedAttributes);

        //
        // Build parts and write headers and offset tables to file.
        //

        for (size_t i = 0; i < _data->_headers.size (); i++)
            _data->parts.push_back (new OutputPartData (
                _data, _data->_headers[i], i, numThreads, parts > 1));

        writeMagicNumberAndVersionField (
            *_data->os, &_data->_headers[0], _data->_headers.size ());
        _data->writeHeadersToFile (_data->_headers);
        _data->writeChunkTableOffsets (_data->parts);
    }
    catch (IEX_NAMESPACE::BaseExc& e)
    {
        delete _data;

        REPLACE_EXC (
            e,
            "Cannot open image stream "
            "\"" << os.fileName ()
                 << "\". " << e.what ());
        throw;
    }
    catch (...)
    {
        delete _data;
        throw;
    }
}